

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscWriterNaive.cpp
# Opt level: O3

void __thiscall
adios2::core::engine::ssc::SscWriterNaive::Close(SscWriterNaive *this,int transportIndex)

{
  void *__ptr;
  int globalSize;
  undefined4 local_14;
  
  local_14 = 1;
  __ptr = malloc(1);
  if ((this->super_SscWriterBase).m_WriterRank == 0) {
    MPI_Send(&local_14,1,&ompi_mpi_int,(this->super_SscWriterBase).m_ReaderMasterStreamRank,0,
             (this->super_SscWriterBase).m_StreamComm);
    MPI_Send(__ptr,local_14,&ompi_mpi_char,(this->super_SscWriterBase).m_ReaderMasterStreamRank,0,
             (this->super_SscWriterBase).m_StreamComm);
  }
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  return;
}

Assistant:

void SscWriterNaive::Close(const int transportIndex)
{

    int globalSize = 1;
    ssc::Buffer globalBuffer(globalSize);
    if (m_WriterRank == 0)
    {
        MPI_Send(&globalSize, 1, MPI_INT, m_ReaderMasterStreamRank, 0, m_StreamComm);
        MPI_Send(globalBuffer.data(), globalSize, MPI_CHAR, m_ReaderMasterStreamRank, 0,
                 m_StreamComm);
    }
}